

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void set_get_max_keylen(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  size_t sVar2;
  char *__format;
  int i;
  long lVar3;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  size_t rvalue_len;
  void *rvalue;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [65408];
  fdb_kvs_handle *pfStack_100d8;
  fdb_file_handle *pfStack_100d0;
  size_t sStack_100c8;
  void *pvStack_100c0;
  fdb_kvs_config fStack_100b8;
  timeval tStack_100a0;
  fdb_config fStack_10090;
  char local_ff98 [65416];
  
  gettimeofday(&tStack_100a0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_10090.chunksize = 0x10;
  system("rm -rf  dummy* > errorlog.txt");
  for (lVar3 = 0; lVar3 != 0xff80; lVar3 = lVar3 + 1) {
    local_ff98[lVar3] = 'a';
  }
  local_ff98[0xff7f] = 0;
  fVar1 = fdb_open(&pfStack_100d0,"./dummy1",&fStack_10090);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x15e);
    set_get_max_keylen()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x15e,"void set_get_max_keylen()");
  }
  fVar1 = fdb_kvs_open_default(pfStack_100d0,&pfStack_100d8,&fStack_100b8);
  handle = pfStack_100d8;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x160);
    set_get_max_keylen()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x160,"void set_get_max_keylen()");
  }
  sVar2 = strlen(local_ff98);
  fVar1 = fdb_set_kv(handle,local_ff98,sVar2,(void *)0x0,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_get(pfStack_100d8,(fdb_doc *)0x0);
    if (fVar1 != FDB_RESULT_INVALID_ARGS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x168);
      set_get_max_keylen()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x168,"void set_get_max_keylen()");
    }
    sVar2 = strlen(local_ff98);
    fVar1 = fdb_get_kv(pfStack_100d8,local_ff98,sVar2,&pvStack_100c0,&sStack_100c8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_close(pfStack_100d0);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (set_get_max_keylen()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"set get max keylen");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x16c);
    set_get_max_keylen()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x16c,"void set_get_max_keylen()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x164);
  set_get_max_keylen()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x164,"void set_get_max_keylen()");
}

Assistant:

void set_get_max_keylen()
{
    TEST_INIT();
    memleak_start();

    int r;
    static const int len = FDB_MAX_KEYLEN;
    char keybuf[len];
    void *rvalue;
    size_t rvalue_len;
    static const char *achar = "a";

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.chunksize = 16;


    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    for (int i = 0; i < len; ++i) {
        keybuf[i] = *achar;
    }
    keybuf[len-1] = '\0';

    // open db
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set kv
    status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get NULL pointer
    status = fdb_get(db, NULL);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // get kv
    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("set get max keylen");
}